

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# olsrv2_routing.c
# Opt level: O2

void olsrv2_routing_force_update(_Bool skip_wait)

{
  nhdp_domain *domain;
  olsrv2_routing_entry *rtentry;
  byte bVar1;
  uint pathcost;
  uint uVar2;
  undefined8 uVar3;
  oonf_log_source source;
  _Bool _Var4;
  _Bool _Var5;
  int iVar6;
  list_entity *plVar7;
  list_entity *plVar8;
  avl_tree *paVar9;
  list_entity *plVar10;
  list_entity *plVar11;
  netaddr *pnVar12;
  ulong uVar13;
  avl_tree *paVar14;
  avl_node *paVar15;
  char *pcVar16;
  char *pcVar17;
  long lVar18;
  list_entity **pplVar19;
  byte bVar20;
  os_route_str rbuf1;
  os_route_str local_192;
  
  bVar20 = 0;
  if ((_initiate_shutdown != '\0') || (_freeze_routes)) {
    return;
  }
  if (_rate_limit_timer._clock != 0) {
    if (!skip_wait) {
      _trigger_dijkstra = 1;
      if ((log_global_mask[LOG_OLSRV2_ROUTING] & 1) == 0) {
        _trigger_dijkstra = 1;
        return;
      }
      oonf_log(LOG_SEVERITY_DEBUG,LOG_OLSRV2_ROUTING,"src/olsrv2/olsrv2/olsrv2_routing.c",0x13e,
               (void *)0x0,0,"Delay Dijkstra");
      return;
    }
    oonf_timer_stop(&_rate_limit_timer);
  }
  uVar13 = (ulong)LOG_OLSRV2_ROUTING;
  if (_update_ansn == true) {
    _ansn = _ansn + 1;
    _update_ansn = false;
    if ((log_global_mask[uVar13] & 1) != 0) {
      oonf_log(LOG_SEVERITY_DEBUG,LOG_OLSRV2_ROUTING,"src/olsrv2/olsrv2/olsrv2_routing.c",0x147,
               (void *)0x0,0,"Update ANSN to %u",(ulong)_ansn);
      uVar13 = (ulong)LOG_OLSRV2_ROUTING;
    }
  }
  if ((log_global_mask[uVar13] & 1) != 0) {
    oonf_log(LOG_SEVERITY_DEBUG,(oonf_log_source)uVar13,"src/olsrv2/olsrv2/olsrv2_routing.c",0x14a,
             (void *)0x0,0,"Run Dijkstra");
  }
  plVar7 = nhdp_domain_get_list();
  do {
    do {
      plVar7 = plVar7->next;
      plVar10 = plVar7->prev;
      plVar8 = nhdp_domain_get_list();
      if (plVar10 == plVar8->prev) {
        _process_kernel_queue();
        oonf_timer_set_ext(&_rate_limit_timer,1000,1000);
        return;
      }
      iVar6 = *(int *)((long)&plVar7[-0x27].next + 4);
    } while (_domain_changed[iVar6] != true);
    domain = (nhdp_domain *)(plVar7 + -0x2a);
    _domain_changed[iVar6] = false;
    paVar9 = _routing_tree + iVar6;
    while (paVar9 = (avl_tree *)(paVar9->list_head).next,
          (paVar9->list_head).prev != _routing_tree[iVar6].list_head.prev) {
      *(undefined1 *)((long)&paVar9[-3].list_head.next + 3) = 0;
      paVar14 = paVar9 + -9;
      pplVar19 = &paVar9[-3].list_head.prev;
      for (lVar18 = 0x5c; lVar18 != 0; lVar18 = lVar18 + -1) {
        *(undefined1 *)pplVar19 = *(undefined1 *)&(paVar14->list_head).next;
        paVar14 = (avl_tree *)((long)paVar14 + (ulong)bVar20 * -2 + 1);
        pplVar19 = (list_entity **)((long)pplVar19 + (ulong)bVar20 * -2 + 1);
      }
      iVar6 = *(int *)((long)&plVar7[-0x27].next + 4);
    }
    _prepare_nodes();
    _Var4 = _check_ssnode_split(domain,2);
    _run_dijkstra(domain,2,true,!_Var4);
    _Var5 = _check_ssnode_split(domain,10);
    _run_dijkstra(domain,10,true,!_Var5);
    if (_Var4 || _Var5) {
      _prepare_nodes();
      if (_Var4) {
        _run_dijkstra(domain,2,false,true);
      }
      if (_Var5) {
        _run_dijkstra(domain,10,false,true);
      }
    }
    plVar10 = nhdp_db_get_neigh_list();
    while( true ) {
      plVar10 = plVar10->next;
      plVar8 = plVar10->prev;
      plVar11 = nhdp_db_get_neigh_list();
      if (plVar8 == plVar11->prev) break;
      if ((*(int *)((long)&plVar10[-9].prev + 4) != 0) &&
         (pathcost = *(uint *)((long)&plVar10[(long)*(int *)((long)&plVar7[-0x27].next + 4) * 2 + 4]
                                      .prev + 4), pathcost < 0xffff01)) {
        pplVar19 = &plVar10[-10].prev;
        bVar1 = *(byte *)&plVar10[-9].prev;
        plVar8 = plVar10 + -5;
        while (plVar8 = plVar8->next, plVar8->prev != plVar10[-5].prev) {
          _Var4 = olsrv2_is_nhdp_routable((netaddr *)&plVar8[-9].prev);
          if (_Var4) {
            pnVar12 = olsrv2_originator_get((uint)bVar1);
            if (pnVar12 == (netaddr *)0x0) {
              pnVar12 = &NETADDR_UNSPEC;
            }
            os_routing_generic_init_half_os_route_key
                      ((netaddr *)(rbuf1.buf + 0x12),(netaddr *)&rbuf1,(netaddr *)&plVar8[-9].prev);
            _update_routing_entry
                      (domain,(os_route_key *)&rbuf1,pnVar12,(nhdp_neighbor *)pplVar19,'\0',pathcost
                       ,'\x01',true,pnVar12);
          }
        }
        plVar8 = plVar10 + -6;
        while (plVar8 = plVar8->next, plVar8->prev != plVar10[-6].prev) {
          plVar11 = (list_entity *)&plVar8[-5].prev;
          while( true ) {
            plVar11 = plVar11->next;
            if (plVar11->prev == plVar8[-4].next) break;
            if ((plVar11[-1].prev == (list_entity *)0x0) &&
               (uVar2 = *(uint *)((long)&plVar11[7].next +
                                 (long)*(int *)((long)&plVar7[-0x27].next + 4) * 0xc + 4),
               uVar2 < 0xffff01)) {
              os_routing_generic_init_half_os_route_key
                        ((netaddr *)(rbuf1.buf + 0x12),(netaddr *)&rbuf1,(netaddr *)(plVar11 + -8));
              _update_routing_entry
                        (domain,(os_route_key *)&rbuf1,&NETADDR_UNSPEC,(nhdp_neighbor *)pplVar19,
                         '\0',uVar2 + pathcost,'\x02',false,(netaddr *)pplVar19);
            }
          }
        }
      }
    }
    uVar13 = (ulong)*(int *)((long)&plVar7[-0x27].next + 4);
    paVar9 = _routing_tree + uVar13;
    while (paVar9 = (avl_tree *)(paVar9->list_head).next,
          (paVar9->list_head).prev != _routing_tree[(int)uVar13].list_head.prev) {
      paVar15 = paVar9[-5].root;
      *(char *)((long)&paVar9[-7].list_head.next + 4) =
           (char)_domain_parameter[*(int *)&paVar15->field_0x34].table;
      *(char *)((long)&paVar9[-7].list_head.next + 5) =
           (char)_domain_parameter[*(int *)&paVar15->field_0x34].protocol;
      *(int *)&paVar9[-7].list_head.next = _domain_parameter[*(int *)&paVar15->field_0x34].distance;
      if (((*(char *)((long)&paVar9[-3].list_head.next + 3) == '\x01') &&
          (_domain_parameter[*(int *)&paVar15->field_0x34].use_srcip_in_routes == true)) &&
         ((char)paVar9[-9].count == '\x02')) {
        pnVar12 = olsrv2_originator_get(2);
        uVar3 = *(undefined8 *)(pnVar12->_addr + 8);
        *(undefined8 *)((long)&paVar9[-8].root + 6) = *(undefined8 *)pnVar12->_addr;
        *(undefined8 *)&paVar9[-8].field_0x1e = uVar3;
        *(undefined2 *)((long)&paVar9[-8].comp + 6) = *(undefined2 *)&pnVar12->_type;
      }
      paVar14 = olsrv2_lan_get_tree();
      paVar15 = avl_find(paVar14,&paVar9[-9].list_head.prev);
      if (((paVar15 != (avl_node *)0x0) &&
          (lVar18 = (long)*(int *)((long)&plVar7[-0x27].next + 4),
          *(char *)((long)&paVar15[1].list.prev + lVar18 * 8 + 1) == '\x01')) &&
         (*(uint *)((long)&paVar15[1].list.next + lVar18 * 8 + 4) < paVar9[-5].count)) {
        *(undefined1 *)((long)&paVar9[-3].list_head.next + 3) = 0;
      }
      rtentry = (olsrv2_routing_entry *)(paVar9 + -9);
      plVar10 = &_routing_filter_list;
      while (plVar10 = plVar10->next, plVar10->prev != _routing_filter_list.prev) {
        (*(code *)plVar10[-1].prev)
                  (domain,rtentry,*(undefined1 *)((long)&paVar9[-3].list_head.next + 3));
      }
      if (*(char *)((long)&paVar9[-3].list_head.next + 3) == '\x01') {
        pplVar19 = &paVar9[-3].list_head.prev;
        iVar6 = bcmp(pplVar19,rtentry,0x5c);
        source = LOG_OLSRV2_ROUTING;
        if (iVar6 != 0) goto LAB_00132d78;
        if ((log_global_mask[LOG_OLSRV2_ROUTING] & 2) != 0) {
          pcVar16 = os_routing_generic_rt_to_string(&rbuf1,(os_route_parameter *)pplVar19);
          pcVar17 = os_routing_generic_rt_to_string(&local_192,(os_route_parameter *)rtentry);
          oonf_log(LOG_SEVERITY_INFO,source,"src/olsrv2/olsrv2/olsrv2_routing.c",0x446,(void *)0x0,0
                   ,"Ignore route change: %s -> %s",pcVar16,pcVar17);
        }
      }
      else {
LAB_00132d78:
        _add_route_to_kernel_queue(rtentry);
      }
      uVar13 = (ulong)*(uint *)((long)&plVar7[-0x27].next + 4);
    }
  } while( true );
}

Assistant:

void
olsrv2_routing_force_update(bool skip_wait) {
  struct nhdp_domain *domain;
  bool splitv4, splitv6;

  if (_initiate_shutdown || _freeze_routes) {
    /* no dijkstra anymore when in shutdown */
    return;
  }

  /* handle dijkstra rate limitation timer */
  if (oonf_timer_is_active(&_rate_limit_timer)) {
    if (!skip_wait) {
      /* trigger dijkstra later */
      _trigger_dijkstra = true;

      OONF_DEBUG(LOG_OLSRV2_ROUTING, "Delay Dijkstra");
      return;
    }
    oonf_timer_stop(&_rate_limit_timer);
  }

  if (_update_ansn) {
    _ansn++;
    _update_ansn = false;
    OONF_DEBUG(LOG_OLSRV2_ROUTING, "Update ANSN to %u", _ansn);
  }

  OONF_DEBUG(LOG_OLSRV2_ROUTING, "Run Dijkstra");

  list_for_each_element(nhdp_domain_get_list(), domain, _node) {
    /* check if dijkstra is necessary */
    if (!_domain_changed[domain->index]) {
      /* nothing to do for this domain */
      continue;
    }
    _domain_changed[domain->index] = false;

    /* initialize dijkstra specific fields */
    _prepare_routes(domain);
    _prepare_nodes();

    /* run IPv4 dijkstra (might be two times because of source-specific data) */
    splitv4 = _check_ssnode_split(domain, AF_INET);
    _run_dijkstra(domain, AF_INET, true, !splitv4);

    /* run IPv6 dijkstra (might be two times because of source-specific data) */
    splitv6 = _check_ssnode_split(domain, AF_INET6);
    _run_dijkstra(domain, AF_INET6, true, !splitv6);

    /* handle source-specific sub-topology if necessary */
    if (splitv4 || splitv6) {
      /* re-initialize dijkstra specific node fields */
      _prepare_nodes();

      if (splitv4) {
        _run_dijkstra(domain, AF_INET, false, true);
      }
      if (splitv6) {
        _run_dijkstra(domain, AF_INET6, false, true);
      }
    }

    /* check if direct one-hop routes are quicker */
    _handle_nhdp_routes(domain);

    /* update kernel routes */
    _process_dijkstra_result(domain);
  }

  _process_kernel_queue();

  /* make sure dijkstra is not called too often */
  oonf_timer_set(&_rate_limit_timer, OLSRv2_DIJKSTRA_RATE_LIMITATION);
}